

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_CLOCK_INFO_Unmarshal(TPMS_CLOCK_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_CLOCK_INFO *target_local;
  
  target_local._4_4_ = UINT64_Unmarshal(&target->clock,buffer,size);
  if (((target_local._4_4_ == 0) &&
      (target_local._4_4_ = UINT32_Unmarshal(&target->resetCount,buffer,size),
      target_local._4_4_ == 0)) &&
     (target_local._4_4_ = UINT32_Unmarshal(&target->restartCount,buffer,size),
     target_local._4_4_ == 0)) {
    target_local._4_4_ = TPMI_YES_NO_Unmarshal(&target->safe,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_CLOCK_INFO_Unmarshal(TPMS_CLOCK_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->clock), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->resetCount), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->restartCount), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_YES_NO_Unmarshal((TPMI_YES_NO *)&(target->safe), buffer, size);
    return result;
}